

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

double __thiscall ipx::Basis::DensityInverse(Basis *this)

{
  allocator_type *__a;
  reference pvVar1;
  long in_RDI;
  Int i;
  double density;
  vector<int,_std::allocator<int>_> rowcounts;
  Int m;
  Int *in_stack_ffffffffffffff88;
  Basis *in_stack_ffffffffffffff90;
  undefined1 *__n;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar2;
  double local_48;
  undefined1 local_29;
  vector<int,_std::allocator<int>_> local_28;
  Int local_c;
  
  local_c = Model::rows(*(Model **)(in_RDI + 8));
  __a = (allocator_type *)(long)local_c;
  __n = &local_29;
  std::allocator<int>::allocator((allocator<int> *)0x80ec59);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(size_type)__n,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x80ec79);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x80ec83);
  SymbolicInvert(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(Int *)0x80ec94);
  local_48 = 0.0;
  for (iVar2 = 0; iVar2 < local_c; iVar2 = iVar2 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)iVar2);
    local_48 = ((double)*pvVar1 * 1.0) / (double)local_c + local_48;
  }
  local_48 = local_48 / (double)local_c;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  return local_48;
}

Assistant:

double Basis::DensityInverse() const {
    Int m = model_.rows();
    std::vector<Int> rowcounts(m);
    SymbolicInvert(rowcounts.data(), nullptr);
    // Accumulating rowcounts would result in overflow for large LPs.
    double density = 0.0;
    for (Int i = 0; i < m; i++)
        density += 1.0*rowcounts[i]/m;
    return density/m;
}